

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void firstStage(vector<Crawler_*,_std::allocator<Crawler_*>_> *crawlers,Logger *logger)

{
  ostream *poVar1;
  uint i;
  int iVar2;
  long lVar3;
  string local_68;
  list<bdNodeId,_std::allocator<bdNodeId>_> tempIDStorage;
  
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    Crawler::startDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar3]);
  }
  Logger::enable(logger,true);
  tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node._M_size = 0;
  tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&tempIDStorage;
  tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&tempIDStorage;
  for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
    sleep(0xf);
    Logger::getDiscoveredPeers_abi_cxx11_();
    std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::merge
              (&tempIDStorage,(list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_68);
    std::__cxx11::_List_base<bdNodeId,_std::allocator<bdNodeId>_>::_M_clear
              ((_List_base<bdNodeId,_std::allocator<bdNodeId>_> *)&local_68);
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      Crawler::enable((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar3],false);
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Waiting for crawler ");
      std::__cxx11::to_string(&local_68,(uint)lVar3);
      poVar1 = std::operator<<(poVar1,(string *)&local_68);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_68);
      Crawler::enableDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar3],false);
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      Crawler::getToCheckList_abi_cxx11_
                ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_68,
                 (crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar3]);
      std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::merge
                (&tempIDStorage,(list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_68);
      std::__cxx11::_List_base<bdNodeId,_std::allocator<bdNodeId>_>::_M_clear
                ((_List_base<bdNodeId,_std::allocator<bdNodeId>_> *)&local_68);
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      Crawler::extractToCheckList
                ((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar3],&tempIDStorage);
      Crawler::enableDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar3],true);
      Crawler::enable((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar3],true);
    }
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    Crawler::enable((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar3],false);
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Waiting for crawler ");
    std::__cxx11::to_string(&local_68,(uint)lVar3);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_68);
    Crawler::enableDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl
                       .super__Vector_impl_data._M_start[lVar3],false);
  }
  Logger::enable(logger,false);
  std::__cxx11::_List_base<bdNodeId,_std::allocator<bdNodeId>_>::_M_clear
            (&tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>);
  return;
}

Assistant:

void firstStage(std::vector<Crawler*>& crawlers, Logger& logger) {
    // Launch crawlers and logger
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++)
        crawlers[i]->startDht();
    logger.enable(true);

    std::list<bdNodeId> tempIDStorage;
    for (unsigned int i = 0; i < CRAWLS_COUNT; i++) {
        // Waiting for crawlers duty
        sleep(CRAWL_DURATION);
        // Get the previously found peers
        tempIDStorage.merge(Logger::getDiscoveredPeers());
        // Sorting out of region IDs
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++)
            crawlers[j]->enable(false);
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++) {
            std::cerr << "Waiting for crawler " << std::to_string(j) << std::endl;
            crawlers[j]->enableDht(false);
        }
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++)
            // Get the found nodes lists
            tempIDStorage.merge(crawlers[j]->getToCheckList());
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++) {
            // Restart nodes, not to hold the handler for too long
//            crawlers[j]->restart();
            // Inject new peers to check and activate crawlers
            crawlers[j]->extractToCheckList(tempIDStorage);
            crawlers[j]->enableDht(true);
            crawlers[j]->enable(true);
        }
    }
    // Pause crawling and logging
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++)
        crawlers[i]->enable(false);
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++) {
        std::cerr << "Waiting for crawler " << std::to_string(i) << std::endl;
        crawlers[i]->enableDht(false);
    }
    logger.enable(false);
}